

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type input_variable_type,uint array_size)

{
  uint uVar1;
  ostream *poVar2;
  _variable_type type;
  long lVar3;
  char *pcVar4;
  stringstream array_index_stringstream;
  stringstream array_size_stringstream;
  stringstream result_sstream;
  long *local_528;
  long local_520;
  long local_518 [2];
  long *local_508;
  long local_500;
  long local_4f8 [2];
  string local_4e8;
  stringstream local_4c8 [16];
  undefined1 local_4b8 [376];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_340);
  if (1 < array_size) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[0]",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  }
  if ((input_variable_type - VARIABLE_TYPE_DMAT2 < 0x1a) &&
     ((0x3fe01ffU >> (input_variable_type - VARIABLE_TYPE_DMAT2 & 0x1f) & 1) != 0)) {
    lVar3 = 5;
    pcVar4 = "[0].x";
  }
  else {
    uVar1 = Utils::getNumberOfComponentsForVariableType(input_variable_type);
    if (uVar1 < 2) goto LAB_0094e7e5;
    lVar3 = 3;
    pcVar4 = "[0]";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar4,lVar3);
LAB_0094e7e5:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400\n\nin ",0x11);
  Utils::getVariableTypeString_abi_cxx11_(&local_4e8,(Utils *)(ulong)input_variable_type,type);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," test_input",0xb);
  std::__cxx11::stringbuf::str();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_508,local_500);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,";\n\nout float test_output;\n\nvoid main()\n{\n    if (test_input",0x3b);
  std::__cxx11::stringbuf::str();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_528,local_520);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             " > 2.0)\n    {\n        test_output = 1.0;\n    }\n    else\n    {\n        test_output = 3.0;\n    }\n}\n"
             ,0x61);
  if (local_528 != local_518) {
    operator_delete(local_528,local_518[0] + 1);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508,local_4f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(
	Utils::_variable_type input_variable_type, unsigned int array_size)
{
	std::stringstream result_sstream;
	std::stringstream array_index_stringstream;
	std::stringstream array_size_stringstream;

	if (array_size > 1)
	{
		array_index_stringstream << "[0]";
		array_size_stringstream << "[" << array_size << "]";
	}

	if (Utils::isMatrixVariableType(input_variable_type))
	{
		array_index_stringstream << "[0].x";
	}
	else if (Utils::getNumberOfComponentsForVariableType(input_variable_type) > 1)
	{
		array_index_stringstream << "[0]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "in "
				   << Utils::getVariableTypeString(input_variable_type) << " test_input"
				   << array_size_stringstream.str() << ";\n"
													   "\n"
													   "out float test_output;\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    if (test_input"
				   << array_index_stringstream.str() << " > 2.0)\n"
														"    {\n"
														"        test_output = 1.0;\n"
														"    }\n"
														"    else\n"
														"    {\n"
														"        test_output = 3.0;\n"
														"    }\n"
														"}\n";

	return result_sstream.str();
}